

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O0

int USHAHashSizeBits(SHAversion whichSha)

{
  int local_c;
  SHAversion whichSha_local;
  
  switch(whichSha) {
  case SHA1:
    local_c = 0xa0;
    break;
  case SHA224:
    local_c = 0xe0;
    break;
  case SHA256:
    local_c = 0x100;
    break;
  case SHA384:
    local_c = 0x180;
    break;
  default:
    local_c = 0x200;
  }
  return local_c;
}

Assistant:

int USHAHashSizeBits(enum SHAversion whichSha)
{
    switch (whichSha) {
    case SHA1:   return SHA1HashSizeBits;
    case SHA224: return SHA224HashSizeBits;
    case SHA256: return SHA256HashSizeBits;
    case SHA384: return SHA384HashSizeBits;
    default:
    case SHA512: return SHA512HashSizeBits;
    }
}